

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateBinaryOp(ExpressionContext *ctx,SynBase *source,SynBinaryOpType op,ExprBase *lhs,ExprBase *rhs
              )

{
  long lVar1;
  TypeBase *pTVar2;
  TypeStruct *pTVar3;
  SynBase *pSVar4;
  IntrusiveList<TypeHandle> arguments;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ExprError *pEVar9;
  undefined4 extraout_var;
  size_t sVar10;
  TypeBase *pTVar11;
  TypeBase *pTVar12;
  TypeUnsizedArray *pTVar13;
  TypeHandle *node;
  TypeFunction *pTVar14;
  ExprBase *arg0;
  ExprBase *arg1;
  ExprError *pEVar15;
  TypeRef *type;
  char *pcVar16;
  undefined4 extraout_var_03;
  char *pcVar17;
  TypeUnsizedArray *pTVar18;
  TypeUnsizedArray *pTVar19;
  char *pcVar20;
  TypeBase *pTVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  uint *this;
  bool bVar25;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  TypeBase *local_78;
  IntrusiveList<TypeHandle> types;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pTVar11 = lhs->type;
  if (((pTVar11 != (TypeBase *)0x0) && (pTVar11->typeID == 0)) ||
     ((pTVar2 = rhs->type, pTVar2 != (TypeBase *)0x0 && (pTVar2->typeID == 0)))) {
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar9 = (ExprError *)CONCAT44(extraout_var,iVar8);
    pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    (pEVar9->super_ExprBase).typeID = 0x14;
    (pEVar9->super_ExprBase).source = source;
    (pEVar9->super_ExprBase).type = pTVar11;
    (pEVar9->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar9->super_ExprBase).listed = false;
    (pEVar9->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229be0;
    *(SynBinaryOpType *)&(pEVar9->super_ExprBase).field_0x2c = op;
    (pEVar9->values).data = (ExprBase **)lhs;
    *(ExprBase **)&(pEVar9->values).count = rhs;
    return &pEVar9->super_ExprBase;
  }
  if (op == SYN_BINARY_OP_IN) {
    pcVar20 = "in";
    pcVar17 = "";
    bVar5 = false;
    bVar6 = false;
    goto LAB_00151f7d;
  }
  uVar24 = op - SYN_BINARY_OP_EQUAL;
  pEVar9 = (ExprError *)(ulong)uVar24;
  if (uVar24 < 2) {
    if (pTVar11 != pTVar2) {
      if (pTVar11 == ctx->typeNullPtr) {
        lhs = CreateCast(ctx,source,lhs,pTVar2,false);
      }
      if (rhs->type == ctx->typeNullPtr) {
        rhs = CreateCast(ctx,source,rhs,lhs->type,false);
      }
    }
    pTVar3 = (TypeStruct *)lhs->type;
    if ((pTVar3 == ctx->typeAutoRef) && (pTVar3 == (TypeStruct *)rhs->type)) {
      pcVar20 = "__rncomp";
      if (op == SYN_BINARY_OP_EQUAL) {
        pcVar20 = "__rcomp";
      }
      lVar1 = (long)pcVar20 - (ulong)(op == SYN_BINARY_OP_EQUAL);
LAB_00152357:
      bVar5 = true;
      bVar6 = true;
      pcVar17 = (char *)(lVar1 + 8);
LAB_00151f7d:
      name.end = pcVar17;
      name.begin = pcVar20;
      pEVar9 = (ExprError *)CreateFunctionCall2(ctx,source,name,lhs,rhs,false,bVar6,bVar5);
      return &pEVar9->super_ExprBase;
    }
    if (pTVar3 != (TypeStruct *)0x0) {
      if (((pTVar3->super_TypeBase).typeID == 0x15) && (pTVar3 == (TypeStruct *)rhs->type)) {
        types.head = (TypeHandle *)0x0;
        types.tail = (TypeHandle *)0x0;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        node = (TypeHandle *)CONCAT44(extraout_var_00,iVar8);
        node->type = ctx->typeInt;
        node->next = (TypeHandle *)0x0;
        node->listed = false;
        IntrusiveList<TypeHandle>::push_back(&types,node);
        arguments.tail = types.tail;
        arguments.head = types.head;
        pTVar14 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        arg0 = (ExprBase *)CONCAT44(extraout_var_01,iVar8);
        pSVar4 = lhs->source;
        arg0->typeID = 0x12;
        arg0->source = pSVar4;
        arg0->type = &pTVar14->super_TypeBase;
        arg0->next = (ExprBase *)0x0;
        arg0->listed = false;
        arg0->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        arg0[1]._vptr_ExprBase = (_func_int **)lhs;
        arg0[1].typeID = 0xd;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        arg1 = (ExprBase *)CONCAT44(extraout_var_02,iVar8);
        pSVar4 = rhs->source;
        arg1->typeID = 0x12;
        arg1->source = pSVar4;
        arg1->type = &pTVar14->super_TypeBase;
        arg1->next = (ExprBase *)0x0;
        arg1->listed = false;
        arg1->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        arg1[1]._vptr_ExprBase = (_func_int **)rhs;
        arg1[1].typeID = 0xd;
        pcVar17 = "__pncomp";
        if (op == SYN_BINARY_OP_EQUAL) {
          pcVar17 = "__pcomp";
        }
        name_01.end = pcVar17 + (8 - (ulong)(op == SYN_BINARY_OP_EQUAL));
        name_01.begin = pcVar17;
        pEVar9 = (ExprError *)CreateFunctionCall2(ctx,source,name_01,arg0,arg1,false,true,true);
        return &pEVar9->super_ExprBase;
      }
      if (((pTVar3 != (TypeStruct *)0x0) && ((pTVar3->super_TypeBase).typeID == 0x14)) &&
         (pTVar3 == (TypeStruct *)rhs->type)) {
        pcVar17 = GetOpName(op);
        sVar10 = strlen(pcVar17);
        name_02.end = pcVar17 + sVar10;
        name_02.begin = pcVar17;
        pEVar9 = (ExprError *)CreateFunctionCall2(ctx,source,name_02,lhs,rhs,true,false,true);
        if (pEVar9 != (ExprError *)0x0) {
          return &pEVar9->super_ExprBase;
        }
        pcVar20 = "__ancomp";
        if (op == SYN_BINARY_OP_EQUAL) {
          pcVar20 = "__acomp";
        }
        lVar1 = (long)pcVar20 - (ulong)(op == SYN_BINARY_OP_EQUAL);
        goto LAB_00152357;
      }
    }
    if (pTVar3 != (TypeStruct *)ctx->typeTypeID) goto LAB_001520a8;
    bVar6 = (TypeStruct *)rhs->type == (TypeStruct *)ctx->typeTypeID;
  }
  else {
LAB_001520a8:
    bVar6 = false;
  }
  if (((op == SYN_BINARY_OP_LOGICAL_XOR) && (!bVar6)) &&
     ((lhs->type != (TypeBase *)0x0 && (lhs->type->typeID == 0x18)))) {
    pcVar17 = GetOpName(SYN_BINARY_OP_LOGICAL_XOR);
    sVar10 = strlen(pcVar17);
    name_00.end = pcVar17 + sVar10;
    name_00.begin = pcVar17;
    pEVar9 = (ExprError *)CreateFunctionCall2(ctx,source,name_00,lhs,rhs,true,false,true);
    if (pEVar9 != (ExprError *)0x0) {
      return &pEVar9->super_ExprBase;
    }
  }
  uVar7 = op - SYN_BINARY_OP_LOGICAL_AND;
  if (uVar7 < 3) {
    lhs = CreateConditionCast(ctx,lhs->source,lhs);
    rhs = CreateConditionCast(ctx,rhs->source,rhs);
  }
  pTVar11 = lhs->type;
  if (pTVar11 == ctx->typeVoid) {
    pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar17 = "ERROR: first operand type is \'void\'";
LAB_001521c6:
    pEVar9 = anon_unknown.dwarf_9fd58::ReportExpected(ctx,source,pTVar11,pcVar17);
    return &pEVar9->super_ExprBase;
  }
  pTVar2 = rhs->type;
  if (pTVar2 == ctx->typeVoid) {
    pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar17 = "ERROR: second operand type is \'void\'";
    goto LAB_001521c6;
  }
  bVar5 = ExpressionContext::IsNumericType(ctx,pTVar11);
  if (bVar5) {
    bVar5 = ExpressionContext::IsNumericType(ctx,pTVar2);
  }
  else {
    bVar5 = false;
  }
  if (pTVar11 == (TypeBase *)0x0) {
    bVar25 = false;
  }
  else if (pTVar11->typeID == 0x19) {
    bVar25 = pTVar11 == pTVar2;
  }
  else {
    bVar25 = false;
  }
  bVar22 = bVar25 | bVar5;
  if (uVar24 < 2) {
    bVar23 = 1;
    if (ctx->typeTypeID != pTVar2 || pTVar11 != ctx->typeTypeID) {
      bVar23 = bVar22;
    }
    bVar22 = bVar23;
    if (((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID != 0x12)) ||
       ((pTVar2 == (TypeBase *)0x0 || (pTVar2->typeID != 0x12)))) goto LAB_00152529;
    if ((pTVar11 == (TypeBase *)0x0) || (pTVar12 = pTVar11, pTVar11->typeID != 0x12)) {
      pTVar12 = (TypeBase *)0x0;
    }
    if ((pTVar2 == (TypeBase *)0x0) || (pTVar21 = pTVar2, pTVar2->typeID != 0x12)) {
      pTVar21 = (TypeBase *)0x0;
    }
    if (pTVar11 == pTVar2) {
      bVar22 = 1;
      goto LAB_00152529;
    }
    pTVar18 = (TypeUnsizedArray *)pTVar12[1]._vptr_TypeBase;
    if ((((pTVar18 == (TypeUnsizedArray *)0x0) ||
         ((pTVar18->super_TypeStruct).super_TypeBase.typeID != 0x18)) ||
        (pTVar13 = (TypeUnsizedArray *)pTVar21[1]._vptr_TypeBase, pTVar13 == (TypeUnsizedArray *)0x0
        )) || ((pTVar13->super_TypeStruct).super_TypeBase.typeID != 0x18)) goto LAB_00152529;
    if ((pTVar18 == (TypeUnsizedArray *)0x0) ||
       ((pTVar18->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
      pTVar18 = (TypeUnsizedArray *)0x0;
    }
    if ((pTVar13 == (TypeUnsizedArray *)0x0) ||
       ((pTVar13->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
      pTVar13 = (TypeUnsizedArray *)0x0;
    }
    do {
      pTVar19 = pTVar18;
      pTVar18 = *(TypeUnsizedArray **)&((TypeStruct *)&pTVar19[1].subType)->super_TypeBase;
    } while (pTVar18 != (TypeUnsizedArray *)0x0);
    do {
      pTVar18 = pTVar13;
      pTVar13 = *(TypeUnsizedArray **)&((TypeStruct *)&pTVar18[1].subType)->super_TypeBase;
    } while (pTVar13 != (TypeUnsizedArray *)0x0);
    local_78 = (TypeBase *)0x0;
    if (pTVar19 == pTVar18) {
      local_78 = (TypeBase *)pTVar19;
    }
    bVar23 = 1;
    if (pTVar19 != pTVar18) {
      bVar23 = bVar22;
    }
  }
  else {
LAB_00152529:
    local_78 = (TypeBase *)0x0;
    bVar23 = bVar22;
  }
  if (!bVar6) {
    if (bVar23 == 0) {
      pcVar17 = GetOpName(op);
      sVar10 = strlen(pcVar17);
      bVar23 = 0;
      name_04.end = pcVar17 + sVar10;
      name_04.begin = pcVar17;
      pEVar9 = (ExprError *)CreateFunctionCall2(ctx,source,name_04,lhs,rhs,false,false,true);
      if (pEVar9 != (ExprError *)0x0) {
        return &pEVar9->super_ExprBase;
      }
    }
    else {
      types.head = (TypeHandle *)pTVar11;
      types.tail = (TypeHandle *)pTVar2;
      if (0x14 < op - SYN_BINARY_OP_ADD) {
        __assert_fail("index < N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x115,
                      "T &FixedArray<SmallDenseSet<TypePair, TypePairHasher, 4>, 21>::operator[](unsigned int) [T = SmallDenseSet<TypePair, TypePairHasher, 4>, N = 21]"
                     );
      }
      this = &(ctx->noBinaryOperatorForTypePair).data[op - SYN_BINARY_OP_ADD].bucketCount;
      bVar5 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
                        ((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)this,(TypePair *)&types);
      bVar6 = true;
      pEVar15 = pEVar9;
      if (!bVar5) {
        pcVar17 = GetOpName(op);
        sVar10 = strlen(pcVar17);
        name_03.end = pcVar17 + sVar10;
        name_03.begin = pcVar17;
        pEVar15 = (ExprError *)CreateFunctionCall2(ctx,source,name_03,lhs,rhs,true,false,true);
        bVar6 = pEVar15 == (ExprError *)0x0;
        if (bVar6) {
          SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert
                    ((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)this,(TypePair *)&types);
          pEVar15 = pEVar9;
        }
      }
      if (!bVar6) {
        return &pEVar15->super_ExprBase;
      }
    }
  }
  AssertValueExpression(ctx,lhs->source,lhs);
  AssertValueExpression(ctx,rhs->source,rhs);
  if (bVar23 == 0) {
    pTVar11 = lhs->type;
    goto LAB_001527ad;
  }
  bVar22 = (byte)(0x38180 >> ((byte)op & 0x1f)) & op < SYN_BINARY_OP_LOGICAL_AND;
  pTVar11 = lhs->type;
  if (ctx->typeDouble == pTVar11 || ctx->typeFloat == pTVar11) {
    if ((2 < uVar7 & (bVar22 ^ 1)) == 0) goto LAB_001527ad;
  }
  else if (((2 < uVar7 & (bVar22 ^ 1)) == 0) &&
          (ctx->typeFloat == rhs->type || ctx->typeDouble == rhs->type)) goto LAB_001527ad;
  if (uVar7 < 3) {
    lhs = CreateCast(ctx,source,lhs,ctx->typeBool,false);
    type = (TypeRef *)ctx->typeBool;
LAB_0015278b:
    rhs = CreateCast(ctx,source,rhs,&type->super_TypeBase,false);
  }
  else {
    bVar6 = ExpressionContext::IsNumericType(ctx,pTVar11);
    if (bVar6) {
      pTVar2 = rhs->type;
      bVar6 = ExpressionContext::IsNumericType(ctx,pTVar2);
      if (!bVar6) goto LAB_0015275b;
      type = (TypeRef *)ExpressionContext::GetBinaryOpResultType(ctx,pTVar11,pTVar2);
LAB_0015276c:
      lhs = CreateCast(ctx,source,lhs,&type->super_TypeBase,false);
      goto LAB_0015278b;
    }
LAB_0015275b:
    if (local_78 != (TypeBase *)0x0) {
      type = ExpressionContext::GetReferenceType(ctx,local_78);
      goto LAB_0015276c;
    }
  }
  pTVar11 = lhs->type;
  if (pTVar11 == rhs->type) {
    if (uVar7 < 3) {
      pTVar11 = ctx->typeBool;
    }
    if (op - SYN_BINARY_OP_LESS < 6) {
      pTVar11 = ctx->typeBool;
    }
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar9 = (ExprError *)CONCAT44(extraout_var_03,iVar8);
    (pEVar9->super_ExprBase).typeID = 0x14;
    (pEVar9->super_ExprBase).source = source;
    (pEVar9->super_ExprBase).type = pTVar11;
    (pEVar9->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar9->super_ExprBase).listed = false;
    (pEVar9->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229be0;
    *(SynBinaryOpType *)&(pEVar9->super_ExprBase).field_0x2c = op;
    (pEVar9->values).data = (ExprBase **)lhs;
    *(ExprBase **)&(pEVar9->values).count = rhs;
    if (uVar7 < 3) {
      return &pEVar9->super_ExprBase;
    }
    if (op - SYN_BINARY_OP_LESS < 6) {
      return &pEVar9->super_ExprBase;
    }
    if (bVar22 != 0 || lhs->type != ctx->typeBool) {
      return &pEVar9->super_ExprBase;
    }
    pEVar9 = (ExprError *)CreateCast(ctx,source,(ExprBase *)pEVar9,ctx->typeInt,false);
    return &pEVar9->super_ExprBase;
  }
LAB_001527ad:
  pcVar16 = GetOpName(op);
  pcVar17 = (lhs->type->name).begin;
  pcVar20 = (rhs->type->name).begin;
  pEVar9 = anon_unknown.dwarf_9fd58::ReportExpected
                     (ctx,source,pTVar11,
                      "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",pcVar16,
                      (ulong)(uint)(*(int *)&(lhs->type->name).end - (int)pcVar17),pcVar17,
                      (ulong)(uint)(*(int *)&(rhs->type->name).end - (int)pcVar20),pcVar20);
  return &pEVar9->super_ExprBase;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionContext &ctx, SynBase *source, SynBinaryOpType op, ExprBase *lhs, ExprBase *rhs)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, ctx.GetErrorType(), op, lhs, rhs);

	if(op == SYN_BINARY_OP_IN)
		return CreateFunctionCall2(ctx, source, InplaceStr("in"), lhs, rhs, false, false, false);

	bool skipOverload = false;

	// Built-in comparisons
	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type != rhs->type)
		{
			if(lhs->type == ctx.typeNullPtr)
				lhs = CreateCast(ctx, source, lhs, rhs->type, false);

			if(rhs->type == ctx.typeNullPtr)
				rhs = CreateCast(ctx, source, rhs, lhs->type, false);
		}

		if(lhs->type == ctx.typeAutoRef && lhs->type == rhs->type)
		{
			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__rcomp" : "__rncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeFunction>(lhs->type) && lhs->type == rhs->type)
		{
			IntrusiveList<TypeHandle> types;
			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ctx.typeInt));
			TypeBase *type = ctx.GetFunctionType(source, ctx.typeVoid, types);

			lhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(lhs->source, type, lhs, EXPR_CAST_REINTERPRET);
			rhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(rhs->source, type, rhs, EXPR_CAST_REINTERPRET);

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__pcomp" : "__pncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeUnsizedArray>(lhs->type) && lhs->type == rhs->type)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__acomp" : "__ancomp"), lhs, rhs, false, true, true);
		}

		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			skipOverload = true;
	}

	if(!skipOverload)
	{
		// For ^^ try to find a function before generic condition casts to bool
		if(op == SYN_BINARY_OP_LOGICAL_XOR && isType<TypeClass>(lhs->type))
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;
		}
	}

	// Promotion to bool for some types
	if(op == SYN_BINARY_OP_LOGICAL_AND || op == SYN_BINARY_OP_LOGICAL_OR || op == SYN_BINARY_OP_LOGICAL_XOR)
	{
		lhs = CreateConditionCast(ctx, lhs->source, lhs);
		rhs = CreateConditionCast(ctx, rhs->source, rhs);
	}

	if(lhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: first operand type is 'void'");

	if(rhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: second operand type is 'void'");

	bool hasBuiltIn = false;

	hasBuiltIn |= ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type);
	hasBuiltIn |= isType<TypeEnum>(lhs->type) && lhs->type == rhs->type;

	TypeBase *commonBaseClass = NULL;

	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			hasBuiltIn = true;

		if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
		{
			TypeRef *lhsTypeRef = getType<TypeRef>(lhs->type);
			TypeRef *rhsTypeRef = getType<TypeRef>(rhs->type);

			if(lhs->type == rhs->type)
			{
				hasBuiltIn = true;
			}
			else if(isType<TypeClass>(lhsTypeRef->subType) && isType<TypeClass>(rhsTypeRef->subType))
			{
				TypeClass *lhsTypeClass = getType<TypeClass>(lhsTypeRef->subType);
				TypeClass *rhsTypeClass = getType<TypeClass>(rhsTypeRef->subType);

				while(lhsTypeClass->baseClass)
					lhsTypeClass = lhsTypeClass->baseClass;

				while(rhsTypeClass->baseClass)
					rhsTypeClass = rhsTypeClass->baseClass;

				if(lhsTypeClass == rhsTypeClass)
				{
					hasBuiltIn = true;

					commonBaseClass = lhsTypeClass;
				}
			}
		}
	}

	if(!skipOverload)
	{
		if(!hasBuiltIn)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, false, false, true))
				return result;
		}
		else
		{
			TypePair typePair(lhs->type, rhs->type);

			if(!ctx.noBinaryOperatorForTypePair[int(op) - 1].contains(typePair))
			{
				if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
					return result;
				else
					ctx.noBinaryOperatorForTypePair[int(op) - 1].insert(typePair);
			}
		}
	}

	AssertValueExpression(ctx, lhs->source, lhs);
	AssertValueExpression(ctx, rhs->source, rhs);

	if(!hasBuiltIn)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	bool binaryOp = IsBinaryOp(op);
	bool comparisonOp = IsComparisonOp(op);
	bool logicalOp = IsLogicalOp(op);

	if(ctx.IsFloatingPointType(lhs->type) || ctx.IsFloatingPointType(rhs->type))
	{
		if(logicalOp || binaryOp)
			return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));
	}

	if(logicalOp)
	{
		// Logical operations require both operands to be 'bool'
		lhs = CreateCast(ctx, source, lhs, ctx.typeBool, false);
		rhs = CreateCast(ctx, source, rhs, ctx.typeBool, false);
	}
	else if(ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type))
	{
		// Numeric operations promote both operands to a common type
		TypeBase *commonType = ctx.GetBinaryOpResultType(lhs->type, rhs->type);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}
	else if(commonBaseClass)
	{
		TypeBase *commonType = ctx.GetReferenceType(commonBaseClass);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}

	if(lhs->type != rhs->type)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	TypeBase *resultType = NULL;

	if(comparisonOp || logicalOp)
		resultType = ctx.typeBool;
	else
		resultType = lhs->type;

	ExprBase *result = new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, resultType, op, lhs, rhs);

	// Arithmetic operation on bool results in an int
	if(lhs->type == ctx.typeBool && !binaryOp && !comparisonOp && !logicalOp)
		return CreateCast(ctx, source, result, ctx.typeInt, false);

	return result;
}